

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O1

aom_codec_err_t
decoder_peek_si_internal
          (uint8_t *data,size_t data_sz,aom_codec_stream_info_t *si,int *is_intra_only)

{
  uint8_t *puVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  aom_codec_err_t aVar5;
  int iVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  size_t payload_size;
  size_t bytes_read;
  ObuHeader obu_header;
  int local_c8;
  char local_c4;
  size_t local_c0;
  int local_b8;
  int local_b4;
  size_t local_b0;
  aom_codec_stream_info_t *local_a8;
  aom_codec_err_t local_a0;
  int local_9c;
  aom_read_bit_buffer local_98;
  int *local_70;
  uint *local_68;
  uint *local_60;
  ObuHeader local_58;
  
  if ((long)data_sz < 1) {
    aVar5 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    si->w = 0;
    si->h = 0;
    si->is_kf = 0;
    local_58.has_extension = 0;
    local_58.temporal_layer_id = 0;
    local_58.spatial_layer_id = 0;
    local_58._28_4_ = 0;
    local_58.size = 0;
    local_58.type = 0;
    local_58._9_3_ = 0;
    local_58.has_size_field = 0;
    local_c0 = 0;
    local_b0 = 0;
    aVar5 = aom_read_obu_header_and_size(data,data_sz,si->is_annexb,&local_58,&local_c0,&local_b0);
    if (aVar5 == AOM_CODEC_OK) {
      if (local_58.type == OBU_TEMPORAL_DELIMITER) {
        uVar13 = local_c0 + local_b0;
        bVar16 = data_sz < uVar13;
        data_sz = data_sz - uVar13;
        if (bVar16) {
          return AOM_CODEC_CORRUPT_FRAME;
        }
        data = data + uVar13;
        aVar5 = aom_read_obu_header_and_size
                          (data,data_sz,si->is_annexb,&local_58,&local_c0,&local_b0);
        if (aVar5 != AOM_CODEC_OK) {
          return aVar5;
        }
      }
      local_60 = &si->number_spatial_layers;
      local_68 = &si->number_temporal_layers;
      local_b4 = 0;
      bVar3 = false;
      bVar16 = false;
      local_c8 = 0;
      local_a8 = si;
      while( true ) {
        uVar13 = data_sz - local_b0;
        aVar5 = AOM_CODEC_CORRUPT_FRAME;
        if (uVar13 < local_c0) break;
        puVar1 = data + local_b0;
        if ((local_58.type == OBU_FRAME) || (local_58.type == OBU_FRAME_HEADER)) {
          if ((bVar16) && ((char)local_b4 != '\0')) {
            bVar3 = true;
            bVar16 = true;
            goto LAB_0016595e;
          }
          if (data_sz == local_b0) {
            return AOM_CODEC_CORRUPT_FRAME;
          }
          local_98.bit_buffer_end = data + data_sz;
          local_98.bit_offset = 0;
          local_98.error_handler_data = (void *)0x0;
          local_98.error_handler = (aom_rb_error_handler)0x0;
          local_98.bit_buffer = puVar1;
          iVar6 = aom_rb_read_bit(&local_98);
          bVar17 = true;
          if (iVar6 == 0) {
            uVar10 = aom_rb_read_literal(&local_98,2);
            bVar17 = (uVar10 & 0xff) != 0;
            if (!bVar17) {
              bVar3 = true;
            }
            if ((uVar10 & 0xff) == 2) {
              local_c8 = 1;
            }
          }
          if (!bVar17) goto LAB_0016595e;
        }
        else if (local_58.type == OBU_SEQUENCE_HEADER) {
          if (uVar13 < 2) {
            return AOM_CODEC_CORRUPT_FRAME;
          }
          local_98.bit_buffer_end = data + data_sz;
          local_98.bit_offset = 0;
          local_98.error_handler_data = (void *)0x0;
          local_98.error_handler = (aom_rb_error_handler)0x0;
          local_98.bit_buffer = puVar1;
          av1_read_profile(&local_98);
          iVar6 = aom_rb_read_bit(&local_98);
          local_b4 = aom_rb_read_bit(&local_98);
          if ((char)iVar6 == '\0' && (char)local_b4 != '\0') {
            aVar5 = AOM_CODEC_UNSUP_BITSTREAM;
LAB_00165899:
            local_a0 = aVar5;
            bVar17 = false;
          }
          else {
            if ((char)local_b4 == '\0') {
              iVar6 = aom_rb_read_bit(&local_98);
              uVar15 = CONCAT71((int7)((ulong)&local_98 >> 8),1);
              local_b8 = 1;
              piVar4 = is_intra_only;
              if ((char)iVar6 == '\0') {
LAB_00165796:
                local_70 = piVar4;
                iVar9 = aom_rb_read_bit(&local_98);
                uVar10 = aom_rb_read_literal(&local_98,5);
                local_9c = (uVar10 & 0xff) + 1;
                iVar14 = 0;
                iVar12 = 0;
                do {
                  iVar6 = aom_rb_read_literal(&local_98,0xc);
                  if (iVar14 != 0) {
                    iVar6 = iVar12;
                  }
                  iVar12 = aom_rb_read_literal(&local_98,5);
                  if (7 < iVar12) {
                    aom_rb_read_bit(&local_98);
                  }
                  if (((char)uVar15 == '\0') &&
                     (iVar11 = aom_rb_read_bit(&local_98), iVar12 = local_b8, (char)iVar11 != '\0'))
                  {
                    aom_rb_read_unsigned_literal(&local_98,local_b8);
                    uVar15 = uVar15 & 0xffffffff;
                    aom_rb_read_unsigned_literal(&local_98,iVar12);
                    aom_rb_read_bit(&local_98);
                  }
                  aVar5 = (aom_codec_err_t)uVar15;
                  local_c4 = (char)iVar9;
                  if ((local_c4 != '\0') &&
                     (iVar12 = aom_rb_read_bit(&local_98), (char)iVar12 != '\0')) {
                    aom_rb_read_literal(&local_98,4);
                  }
                  iVar14 = iVar14 + 1;
                  iVar12 = iVar6;
                } while (local_9c != iVar14);
                bVar2 = true;
                is_intra_only = local_70;
              }
              else {
                uVar7 = aom_rb_read_unsigned_literal(&local_98,0x20);
                uVar8 = aom_rb_read_unsigned_literal(&local_98,0x20);
                iVar6 = 0;
                aVar5 = AOM_CODEC_UNSUP_BITSTREAM;
                if (((uVar7 == 0) || (uVar8 == 0)) ||
                   ((iVar12 = aom_rb_read_bit(&local_98), (char)iVar12 != '\0' &&
                    (uVar7 = aom_rb_read_uvlc(&local_98), uVar7 == 0xffffffff)))) {
                  bVar17 = false;
                }
                else {
                  aVar5 = AOM_CODEC_OK;
                  bVar17 = true;
                }
                bVar2 = false;
                if (bVar17) {
                  local_70 = is_intra_only;
                  iVar6 = aom_rb_read_bit(&local_98);
                  uVar15 = 1;
                  piVar4 = local_70;
                  if ((char)iVar6 != '\0') {
                    iVar6 = aom_rb_read_literal(&local_98,5);
                    aom_rb_read_unsigned_literal(&local_98,0x20);
                    aom_rb_read_literal(&local_98,5);
                    aom_rb_read_literal(&local_98,5);
                    local_b8 = iVar6 + 1;
                    uVar15 = 0;
                    piVar4 = local_70;
                  }
                  goto LAB_00165796;
                }
              }
              if (bVar2) goto LAB_00165879;
            }
            else {
              aom_rb_read_literal(&local_98,5);
              iVar6 = 0;
LAB_00165879:
              aVar5 = aom_get_num_layers_from_operating_point_idc(iVar6,local_60,local_68);
              aVar5 = (aom_codec_err_t)(aVar5 != AOM_CODEC_OK);
            }
            if (aVar5 != AOM_CODEC_OK) goto LAB_00165899;
            iVar6 = aom_rb_read_literal(&local_98,4);
            iVar12 = aom_rb_read_literal(&local_98,4);
            iVar6 = aom_rb_read_literal(&local_98,iVar6 + 1);
            iVar12 = aom_rb_read_literal(&local_98,iVar12 + 1);
            local_a8->w = iVar6 + 1;
            local_a8->h = iVar12 + 1;
            bVar16 = true;
            bVar17 = true;
          }
          if (!bVar17) {
            return local_a0;
          }
        }
        data_sz = uVar13 - local_c0;
        if (data_sz == 0) {
LAB_0016595e:
          if ((bVar16) && (bVar3)) {
            local_a8->is_kf = 1;
          }
          if (is_intra_only == (int *)0x0) {
            return AOM_CODEC_OK;
          }
          *is_intra_only = local_c8;
          return AOM_CODEC_OK;
        }
        data = puVar1 + local_c0;
        aVar5 = aom_read_obu_header_and_size
                          (data,data_sz,local_a8->is_annexb,&local_58,&local_c0,&local_b0);
        if (aVar5 != AOM_CODEC_OK) {
          return aVar5;
        }
      }
    }
  }
  return aVar5;
}

Assistant:

static aom_codec_err_t decoder_peek_si_internal(const uint8_t *data,
                                                size_t data_sz,
                                                aom_codec_stream_info_t *si,
                                                int *is_intra_only) {
  int intra_only_flag = 0;
  int got_sequence_header = 0;
  int found_keyframe = 0;

  if (data + data_sz <= data || data_sz < 1) return AOM_CODEC_INVALID_PARAM;

  si->w = 0;
  si->h = 0;
  si->is_kf = 0;  // is_kf indicates whether the current packet contains a RAP

  ObuHeader obu_header;
  memset(&obu_header, 0, sizeof(obu_header));
  size_t payload_size = 0;
  size_t bytes_read = 0;
  uint8_t reduced_still_picture_hdr = 0;
  aom_codec_err_t status = aom_read_obu_header_and_size(
      data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
  if (status != AOM_CODEC_OK) return status;

  // If the first OBU is a temporal delimiter, skip over it and look at the next
  // OBU in the bitstream
  if (obu_header.type == OBU_TEMPORAL_DELIMITER) {
    // Skip any associated payload (there shouldn't be one, but just in case)
    if (data_sz < bytes_read + payload_size) return AOM_CODEC_CORRUPT_FRAME;
    data += bytes_read + payload_size;
    data_sz -= bytes_read + payload_size;

    status = aom_read_obu_header_and_size(
        data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
    if (status != AOM_CODEC_OK) return status;
  }
  while (1) {
    data += bytes_read;
    data_sz -= bytes_read;
    if (data_sz < payload_size) return AOM_CODEC_CORRUPT_FRAME;
    // Check that the selected OBU is a sequence header
    if (obu_header.type == OBU_SEQUENCE_HEADER) {
      // Sanity check on sequence header size
      if (data_sz < 2) return AOM_CODEC_CORRUPT_FRAME;
      // Read a few values from the sequence header payload
      struct aom_read_bit_buffer rb = { data, data + data_sz, 0, NULL, NULL };

      av1_read_profile(&rb);  // profile
      const uint8_t still_picture = aom_rb_read_bit(&rb);
      reduced_still_picture_hdr = aom_rb_read_bit(&rb);

      if (!still_picture && reduced_still_picture_hdr) {
        return AOM_CODEC_UNSUP_BITSTREAM;
      }

      status = parse_operating_points(&rb, reduced_still_picture_hdr, si);
      if (status != AOM_CODEC_OK) return status;

      int num_bits_width = aom_rb_read_literal(&rb, 4) + 1;
      int num_bits_height = aom_rb_read_literal(&rb, 4) + 1;
      int max_frame_width = aom_rb_read_literal(&rb, num_bits_width) + 1;
      int max_frame_height = aom_rb_read_literal(&rb, num_bits_height) + 1;
      si->w = max_frame_width;
      si->h = max_frame_height;
      got_sequence_header = 1;
    } else if (obu_header.type == OBU_FRAME_HEADER ||
               obu_header.type == OBU_FRAME) {
      if (got_sequence_header && reduced_still_picture_hdr) {
        found_keyframe = 1;
        break;
      } else {
        // make sure we have enough bits to get the frame type out
        if (data_sz < 1) return AOM_CODEC_CORRUPT_FRAME;
        struct aom_read_bit_buffer rb = { data, data + data_sz, 0, NULL, NULL };
        const int show_existing_frame = aom_rb_read_bit(&rb);
        if (!show_existing_frame) {
          const FRAME_TYPE frame_type = (FRAME_TYPE)aom_rb_read_literal(&rb, 2);
          if (frame_type == KEY_FRAME) {
            found_keyframe = 1;
            break;  // Stop here as no further OBUs will change the outcome.
          } else if (frame_type == INTRA_ONLY_FRAME) {
            intra_only_flag = 1;
          }
        }
      }
    }
    // skip past any unread OBU header data
    data += payload_size;
    data_sz -= payload_size;
    if (data_sz == 0) break;  // exit if we're out of OBUs
    status = aom_read_obu_header_and_size(
        data, data_sz, si->is_annexb, &obu_header, &payload_size, &bytes_read);
    if (status != AOM_CODEC_OK) return status;
  }
  if (got_sequence_header && found_keyframe) si->is_kf = 1;
  if (is_intra_only != NULL) *is_intra_only = intra_only_flag;
  return AOM_CODEC_OK;
}